

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  secp256k1_fe *a_00;
  secp256k1_fe *r_00;
  undefined1 *puVar1;
  uint64_t *puVar2;
  int *piVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_EAX;
  uint32_t uVar12;
  secp256k1_scratch_space *scratch;
  code *pcVar13;
  byte bVar14;
  long lVar15;
  uint extraout_EDX;
  uint count;
  ulong uVar16;
  long extraout_RDX;
  secp256k1_ge *scratch_00;
  secp256k1_gej *r_01;
  secp256k1_ge *r_02;
  uint uVar17;
  secp256k1_ge *psVar18;
  secp256k1_strauss_point_state *psVar19;
  uchar *out32;
  secp256k1_sha256 *psVar20;
  secp256k1_gej *psVar21;
  secp256k1_gej *psVar22;
  ulong uVar23;
  secp256k1_ge *psVar24;
  secp256k1_gej *psVar25;
  secp256k1_gej *__src;
  secp256k1_gej *psVar26;
  ulong uVar27;
  ulong uVar28;
  secp256k1_ge *a_01;
  ulong uVar29;
  code *cb;
  secp256k1_fe *psVar30;
  secp256k1_ge *psVar31;
  secp256k1_ge *psVar32;
  secp256k1_callback *error_callback;
  secp256k1_sha256 *hash;
  uint uVar33;
  size_t sVar34;
  secp256k1_ge *r_03;
  size_t sVar35;
  secp256k1_ge *r_04;
  secp256k1_scalar *psVar36;
  secp256k1_ge *r_05;
  secp256k1_ge *a_02;
  secp256k1_sha256 *psVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  secp256k1_fe u;
  ulong uStack_29d0;
  secp256k1_strauss_state sStack_29c8;
  secp256k1_strauss_point_state sStack_29b0;
  secp256k1_fe asStack_25a0 [8];
  secp256k1_ge asStack_2420 [8];
  secp256k1_gej *psStack_20d8;
  secp256k1_callback *psStack_20d0;
  secp256k1_ge *psStack_20c0;
  secp256k1_strauss_point_state *psStack_20b8;
  secp256k1_scalar *psStack_20b0;
  undefined1 auStack_2098 [8];
  undefined1 auStack_2090 [176];
  secp256k1_gej sStack_1fe0;
  secp256k1_gej sStack_1f48;
  secp256k1_gej sStack_1eb0;
  secp256k1_gej sStack_1e18;
  secp256k1_gej sStack_1d80;
  secp256k1_gej asStack_1ce8 [2];
  secp256k1_gej asStack_1b68 [5];
  secp256k1_strauss_point_state sStack_1828;
  secp256k1_scratch_space *psStack_1410;
  secp256k1_sha256 *psStack_1408;
  undefined1 *puStack_1400;
  secp256k1_gej *psStack_13f8;
  secp256k1_gej *psStack_13f0;
  code *pcStack_13e8;
  undefined4 uStack_13d6;
  undefined2 uStack_13d2;
  secp256k1_gej *psStack_13d0;
  long lStack_13c8;
  undefined1 auStack_13c0 [40];
  undefined8 uStack_1398;
  uint64_t uStack_1390;
  uint64_t uStack_1388;
  secp256k1_sha256 sStack_1380;
  secp256k1_sha256 sStack_1310;
  secp256k1_gej *psStack_12a8;
  secp256k1_ge *psStack_12a0;
  secp256k1_ge *psStack_1298;
  secp256k1_ge *psStack_1290;
  secp256k1_gej *psStack_1288;
  secp256k1_strauss_point_state *psStack_1280;
  undefined1 auStack_1278 [32];
  undefined1 auStack_1258 [40];
  secp256k1_ge *psStack_1230;
  secp256k1_strauss_point_state *psStack_1228;
  secp256k1_gej sStack_1220;
  secp256k1_gej sStack_1188;
  secp256k1_gej sStack_10f0;
  secp256k1_ge sStack_1058;
  secp256k1_gej sStack_ff0;
  secp256k1_ge asStack_f58 [3];
  secp256k1_ge asStack_dd8 [8];
  secp256k1_strauss_point_state sStack_a98;
  secp256k1_ge *psStack_680;
  secp256k1_ge *psStack_678;
  secp256k1_ge *psStack_670;
  ulong uStack_668;
  secp256k1_ge *psStack_660;
  code *pcStack_658;
  code *pcStack_650;
  uint uStack_63c;
  int iStack_638;
  int iStack_634;
  secp256k1_ge *psStack_630;
  ulong uStack_628;
  secp256k1_ge *psStack_620;
  secp256k1_ge *psStack_618;
  secp256k1_ge *psStack_610;
  secp256k1_ge *psStack_608;
  secp256k1_ge *psStack_600;
  secp256k1_ge *psStack_5f8;
  uint uStack_5e4;
  undefined1 auStack_5e0 [56];
  ulong uStack_5a8;
  ulong uStack_5a0;
  ulong uStack_598;
  ulong uStack_590;
  ulong uStack_588;
  undefined1 auStack_580 [72];
  uint64_t uStack_538;
  uint64_t uStack_530;
  uint64_t uStack_528;
  ulong uStack_520;
  ulong uStack_518;
  secp256k1_ge *psStack_508;
  secp256k1_ge *psStack_500;
  uint64_t uStack_4f8;
  uint64_t uStack_4f0;
  uint64_t uStack_4e8;
  uint64_t uStack_4e0;
  uint64_t uStack_4d8;
  uint64_t uStack_4d0;
  uint64_t uStack_4c8;
  uint64_t uStack_4c0;
  uint64_t uStack_4b8;
  undefined1 auStack_4b0 [56];
  uint64_t uStack_478;
  uint64_t uStack_470;
  uint64_t uStack_468;
  secp256k1_ge *psStack_460;
  uint uStack_458;
  secp256k1_ge sStack_440;
  secp256k1_ge sStack_3d0;
  secp256k1_gej sStack_360;
  secp256k1_fe *psStack_2c8;
  secp256k1_ge *psStack_2c0;
  secp256k1_ge *psStack_2b8;
  secp256k1_ge *psStack_2b0;
  secp256k1_ge *psStack_2a8;
  secp256k1_ge *psStack_2a0;
  undefined1 auStack_290 [92];
  int iStack_234;
  undefined1 auStack_230 [100];
  int iStack_1cc;
  secp256k1_ge sStack_1c8;
  secp256k1_gej *psStack_160;
  secp256k1_gej *psStack_158;
  secp256k1_fe *psStack_150;
  undefined1 *puStack_148;
  secp256k1_fe *psStack_140;
  secp256k1_fe *psStack_138;
  secp256k1_gej sStack_130;
  size_t sStack_98;
  secp256k1_ge *psStack_90;
  secp256k1_ge *psStack_88;
  size_t sStack_80;
  secp256k1_gej *psStack_78;
  code *pcStack_70;
  secp256k1_ge *local_68;
  uint64_t local_60;
  uint64_t uStack_58;
  uint64_t local_50;
  uint64_t uStack_48;
  uint64_t local_40;
  undefined8 uStack_38;
  
  bVar9 = 0;
  psVar21 = a;
  sVar34 = len;
  local_68 = r;
  if (len == 0) {
    return;
  }
  do {
    pcStack_70 = (code *)0x14c648;
    secp256k1_gej_verify(psVar21);
    sVar34 = sVar34 - 1;
    psVar21 = psVar21 + 1;
  } while (sVar34 != 0);
  psVar30 = &a->z;
  sVar35 = 0xffffffffffffffff;
  sVar34 = 0;
  psVar31 = local_68;
  do {
    if ((int)psVar30[1].n[0] == 0) {
      if (sVar35 == 0xffffffffffffffff) {
        uVar4 = psVar30->n[0];
        uVar5 = psVar30->n[1];
        uVar6 = psVar30->n[2];
        uVar7 = psVar30->n[3];
        iVar10 = psVar30->magnitude;
        iVar8 = psVar30->normalized;
        (psVar31->x).n[4] = psVar30->n[4];
        (psVar31->x).magnitude = iVar10;
        (psVar31->x).normalized = iVar8;
        (psVar31->x).n[2] = uVar6;
        (psVar31->x).n[3] = uVar7;
        (psVar31->x).n[0] = uVar4;
        (psVar31->x).n[1] = uVar5;
        sVar35 = sVar34;
      }
      else {
        pcStack_70 = (code *)0x14c690;
        secp256k1_fe_mul(&psVar31->x,&local_68[sVar35].x,psVar30);
        sVar35 = sVar34;
      }
    }
    else {
      pcStack_70 = (code *)0x14c675;
      secp256k1_ge_set_infinity(psVar31);
    }
    psVar18 = local_68;
    sVar34 = sVar34 + 1;
    psVar31 = psVar31 + 1;
    psVar30 = (secp256k1_fe *)(psVar30[3].n + 1);
  } while (len != sVar34);
  if (sVar35 == 0xffffffffffffffff) {
    return;
  }
  psVar31 = (secp256k1_ge *)(sVar35 * 0x68);
  psVar21 = (secp256k1_gej *)(local_68 + sVar35);
  psVar25 = (secp256k1_gej *)&stack0xffffffffffffffa0;
  pcStack_70 = (code *)0x14c6e8;
  secp256k1_fe_inv_var((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar21);
  if (sVar35 == 0) {
    sVar35 = 0;
    psVar32 = psVar18;
  }
  else {
    sVar34 = sVar35 - 1;
    psVar32 = (secp256k1_ge *)&a[sVar35 - 1].infinity;
    psVar31 = psVar18 + -1 + sVar35;
    do {
      if ((int)(psVar32->x).n[0] == 0) {
        pcStack_70 = (code *)0x14c726;
        secp256k1_fe_mul(&local_68[sVar35].x,&psVar31->x,(secp256k1_fe *)&stack0xffffffffffffffa0);
        psVar21 = (secp256k1_gej *)&stack0xffffffffffffffa0;
        pcStack_70 = (code *)0x14c742;
        psVar25 = psVar21;
        secp256k1_fe_mul((secp256k1_fe *)psVar21,(secp256k1_fe *)psVar21,&a[sVar35].z);
        sVar35 = sVar34;
      }
      psVar32 = (secp256k1_ge *)(psVar32[-2].y.n + 1);
      psVar31 = psVar31 + -1;
      bVar38 = sVar34 != 0;
      sVar34 = sVar34 - 1;
    } while (bVar38);
  }
  psVar18 = local_68;
  if (a[sVar35].infinity == 0) {
    puVar2 = local_68[sVar35].x.n + 4;
    *puVar2 = local_40;
    puVar2[1] = uStack_38;
    puVar2 = local_68[sVar35].x.n + 2;
    *puVar2 = local_50;
    puVar2[1] = uStack_48;
    local_68[sVar35].x.n[0] = local_60;
    local_68[sVar35].x.n[1] = uStack_58;
    psVar31 = local_68;
    sVar34 = len;
    if (len == 0) {
      return;
    }
    do {
      if (a->infinity == 0) {
        pcStack_70 = (code *)0x14c7b8;
        secp256k1_ge_set_gej_zinv(psVar31,a,&psVar31->x);
      }
      a = a + 1;
      sVar34 = sVar34 - 1;
      psVar31 = psVar31 + 1;
    } while (sVar34 != 0);
    do {
      pcStack_70 = (code *)0x14c7d0;
      secp256k1_ge_verify(psVar18);
      psVar18 = psVar18 + 1;
      len = len - 1;
    } while (len != 0);
    return;
  }
  pcStack_70 = test_gej_cmov;
  secp256k1_ge_set_all_gej_var_cold_1();
  __src = &sStack_130;
  psVar26 = &sStack_130;
  psStack_138 = (secp256k1_fe *)0x14c817;
  sStack_98 = len;
  psStack_90 = psVar31;
  psStack_88 = psVar32;
  sStack_80 = sVar35;
  psStack_78 = a;
  pcStack_70 = (code *)sVar34;
  memcpy(&sStack_130,psVar25,0x98);
  psStack_138 = (secp256k1_fe *)0x14c81f;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x14c827;
  secp256k1_gej_verify(psVar21);
  psStack_138 = (secp256k1_fe *)0x14c834;
  secp256k1_fe_cmov(&sStack_130.x,&psVar21->x,0);
  psVar30 = &psVar21->y;
  psStack_138 = (secp256k1_fe *)0x14c847;
  secp256k1_fe_cmov(&sStack_130.y,psVar30,0);
  r_00 = &sStack_130.z;
  a_00 = &psVar21->z;
  psStack_138 = (secp256k1_fe *)0x14c85d;
  secp256k1_fe_cmov(r_00,a_00,0);
  psStack_138 = (secp256k1_fe *)0x14c865;
  secp256k1_gej_verify(&sStack_130);
  psStack_138 = (secp256k1_fe *)0x14c870;
  psVar22 = psVar25;
  iVar10 = gej_xyz_equals_gej(&sStack_130,psVar25);
  if (iVar10 == 0) {
    psStack_138 = (secp256k1_fe *)0x14c907;
    test_gej_cmov_cold_2();
  }
  else {
    psStack_138 = (secp256k1_fe *)0x14c883;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x14c88b;
    secp256k1_gej_verify(psVar21);
    psStack_138 = (secp256k1_fe *)0x14c89b;
    secp256k1_fe_cmov(&sStack_130.x,&psVar21->x,1);
    psStack_138 = (secp256k1_fe *)0x14c8ad;
    secp256k1_fe_cmov(&sStack_130.y,psVar30,1);
    psStack_138 = (secp256k1_fe *)0x14c8bd;
    secp256k1_fe_cmov(r_00,a_00,1);
    sStack_130.infinity = sStack_130.infinity & 0xfffffffeU | psVar21->infinity & 1U;
    psStack_138 = (secp256k1_fe *)0x14c8e1;
    secp256k1_gej_verify(&sStack_130);
    psStack_138 = (secp256k1_fe *)0x14c8ec;
    psVar22 = psVar21;
    iVar10 = gej_xyz_equals_gej(&sStack_130,psVar21);
    __src = psVar26;
    if (iVar10 != 0) {
      return;
    }
  }
  psStack_138 = (secp256k1_fe *)gej_xyz_equals_gej;
  test_gej_cmov_cold_1();
  psStack_138 = a_00;
  psStack_140 = psVar30;
  puStack_148 = (undefined1 *)&sStack_130;
  psStack_150 = r_00;
  psStack_158 = psVar25;
  psStack_160 = psVar21;
  if ((*(int *)((long)__src + 0x90) != psVar22->infinity) || (*(int *)((long)__src + 0x90) != 0)) {
    return;
  }
  r_03 = (secp256k1_ge *)(auStack_230 + 0x38);
  psStack_2a0 = (secp256k1_ge *)0x14c959;
  memcpy(r_03,__src,0x98);
  psVar18 = (secp256k1_ge *)auStack_290;
  psStack_2a0 = (secp256k1_ge *)0x14c96e;
  memcpy(psVar18,psVar22,0x98);
  psStack_2a0 = (secp256k1_ge *)0x14c976;
  secp256k1_fe_normalize((secp256k1_fe *)r_03);
  r_05 = &sStack_1c8;
  psStack_2a0 = (secp256k1_ge *)0x14c986;
  secp256k1_fe_normalize(&r_05->x);
  psVar30 = &sStack_1c8.y;
  psStack_2a0 = (secp256k1_ge *)0x14c996;
  secp256k1_fe_normalize(psVar30);
  psStack_2a0 = (secp256k1_ge *)0x14c99e;
  secp256k1_fe_normalize((secp256k1_fe *)psVar18);
  psVar32 = (secp256k1_ge *)(auStack_290 + 0x30);
  psStack_2a0 = (secp256k1_ge *)0x14c9ab;
  secp256k1_fe_normalize((secp256k1_fe *)psVar32);
  r_04 = (secp256k1_ge *)auStack_230;
  psStack_2a0 = (secp256k1_ge *)0x14c9b8;
  secp256k1_fe_normalize((secp256k1_fe *)r_04);
  psStack_2a0 = (secp256k1_ge *)0x14c9c0;
  secp256k1_fe_verify((secp256k1_fe *)r_03);
  psStack_2a0 = (secp256k1_ge *)0x14c9c8;
  psVar31 = psVar18;
  secp256k1_fe_verify((secp256k1_fe *)psVar18);
  if (iStack_1cc == 0) {
    psStack_2a0 = (secp256k1_ge *)0x14cacd;
    gej_xyz_equals_gej_cold_6();
LAB_0014cacd:
    psStack_2a0 = (secp256k1_ge *)0x14cad2;
    gej_xyz_equals_gej_cold_5();
LAB_0014cad2:
    psStack_2a0 = (secp256k1_ge *)0x14cad7;
    gej_xyz_equals_gej_cold_4();
LAB_0014cad7:
    psStack_2a0 = (secp256k1_ge *)0x14cadc;
    gej_xyz_equals_gej_cold_3();
LAB_0014cadc:
    psStack_2a0 = (secp256k1_ge *)0x14cae1;
    gej_xyz_equals_gej_cold_2();
  }
  else {
    if (auStack_290._44_4_ == 0) goto LAB_0014cacd;
    uVar11 = 4;
    do {
      uVar27 = *(ulong *)(auStack_290 + (ulong)uVar11 * 8);
      uVar16 = *(ulong *)(auStack_230 + (ulong)uVar11 * 8 + 0x38);
      if (uVar16 >= uVar27 && uVar16 != uVar27) {
        psVar18 = (secp256k1_ge *)0x1;
        goto LAB_0014ca0a;
      }
      if (uVar16 < uVar27) {
        psVar18 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca0a;
      }
      bVar38 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar38);
    psVar18 = (secp256k1_ge *)0x0;
LAB_0014ca0a:
    psStack_2a0 = (secp256k1_ge *)0x14ca12;
    secp256k1_fe_verify(&r_05->x);
    psStack_2a0 = (secp256k1_ge *)0x14ca1a;
    psVar31 = psVar32;
    secp256k1_fe_verify((secp256k1_fe *)psVar32);
    if (sStack_1c8.x.normalized == 0) goto LAB_0014cad2;
    if (iStack_234 == 0) goto LAB_0014cad7;
    uVar11 = 4;
    do {
      uVar27 = *(ulong *)(auStack_290 + (ulong)uVar11 * 8 + 0x30);
      uVar16 = sStack_1c8.x.n[uVar11];
      if (uVar16 >= uVar27 && uVar16 != uVar27) {
        r_05 = (secp256k1_ge *)0x1;
        goto LAB_0014ca63;
      }
      if (uVar16 < uVar27) {
        r_05 = (secp256k1_ge *)0xffffffff;
        goto LAB_0014ca63;
      }
      bVar38 = uVar11 != 0;
      uVar11 = uVar11 - 1;
    } while (bVar38);
    r_05 = (secp256k1_ge *)0x0;
LAB_0014ca63:
    psStack_2a0 = (secp256k1_ge *)0x14ca6b;
    secp256k1_fe_verify(psVar30);
    psStack_2a0 = (secp256k1_ge *)0x14ca73;
    psVar31 = r_04;
    secp256k1_fe_verify((secp256k1_fe *)r_04);
    if (sStack_1c8.y.normalized == 0) goto LAB_0014cadc;
    if (auStack_230._44_4_ != 0) {
      uVar11 = 4;
      do {
        if (sStack_1c8.y.n[uVar11] != *(uint64_t *)(auStack_230 + (ulong)uVar11 * 8)) {
          return;
        }
        bVar38 = uVar11 != 0;
        uVar11 = uVar11 - 1;
      } while (bVar38);
      return;
    }
  }
  psStack_2a0 = (secp256k1_ge *)test_pre_g_table;
  gej_xyz_equals_gej_cold_1();
  r_02 = &sStack_440;
  psStack_5f8 = (secp256k1_ge *)0x14cb12;
  psStack_508 = psVar31;
  psStack_2c8 = psVar30;
  psStack_2c0 = psVar32;
  psStack_2b8 = r_03;
  psStack_2b0 = r_04;
  psStack_2a8 = r_05;
  psStack_2a0 = psVar18;
  secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)psVar31);
  psStack_5f8 = (secp256k1_ge *)0x14cb1a;
  a_01 = r_02;
  iVar10 = secp256k1_ge_is_valid_var(r_02);
  if (iVar10 != 0) {
    psStack_5f8 = (secp256k1_ge *)0x14cb51;
    secp256k1_gej_set_ge(&sStack_360,&sStack_440);
    psStack_5f8 = (secp256k1_ge *)0x14cb5e;
    secp256k1_gej_double_var(&sStack_360,&sStack_360,(secp256k1_fe *)0x0);
    psStack_5f8 = (secp256k1_ge *)0x14cb6e;
    secp256k1_ge_set_gej_var((secp256k1_ge *)auStack_4b0,&sStack_360);
    r_02 = (secp256k1_ge *)0x40;
    uStack_5e4 = auStack_4b0._40_4_;
    while( true ) {
      uVar11 = uStack_5e4;
      psVar24 = (secp256k1_ge *)(ulong)uStack_5e4;
      a_02 = (secp256k1_ge *)0x3fffffffffffc;
      psVar18 = (secp256k1_ge *)0xffffffffffff;
      psStack_5f8 = (secp256k1_ge *)0x14cb8c;
      secp256k1_fe_verify(&sStack_440.x);
      psVar31 = (secp256k1_ge *)0x1;
      psStack_5f8 = (secp256k1_ge *)0x14cb99;
      secp256k1_fe_verify_magnitude(&sStack_440.x,1);
      auStack_5e0._48_8_ = 0x3ffffbfffff0bc - sStack_440.x.n[0];
      uStack_5a8 = 0x3ffffffffffffc - sStack_440.x.n[1];
      uStack_5a0 = 0x3ffffffffffffc - sStack_440.x.n[2];
      uStack_598 = 0x3ffffffffffffc - sStack_440.x.n[3];
      uStack_590 = 0x3fffffffffffc - sStack_440.x.n[4];
      uStack_588._0_4_ = 2;
      uStack_588._4_4_ = 0;
      r_03 = (secp256k1_ge *)(auStack_5e0 + 0x30);
      psStack_5f8 = (secp256k1_ge *)0x14cbed;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      psStack_5f8 = (secp256k1_ge *)0x14cbf5;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      a_01 = (secp256k1_ge *)auStack_4b0;
      psStack_5f8 = (secp256k1_ge *)0x14cc02;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      if (0x20 < (int)((int)uStack_588 + uVar11)) break;
      uStack_4d0 = auStack_4b0._0_8_;
      uStack_4c8 = auStack_4b0._8_8_;
      auStack_5e0._48_8_ = auStack_5e0._48_8_ + auStack_4b0._0_8_;
      uStack_5a8 = uStack_5a8 + auStack_4b0._8_8_;
      uStack_4c0 = auStack_4b0._16_8_;
      uStack_4b8 = auStack_4b0._24_8_;
      uStack_5a0 = uStack_5a0 + auStack_4b0._16_8_;
      uStack_598 = uStack_598 + auStack_4b0._24_8_;
      uStack_4f8 = auStack_4b0._32_8_;
      uStack_590 = uStack_590 + auStack_4b0._32_8_;
      uStack_588 = (ulong)((int)uStack_588 + uVar11);
      psStack_5f8 = (secp256k1_ge *)0x14cc87;
      auStack_580._56_8_ = r_02;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      psStack_5f8 = (secp256k1_ge *)0x14cc8f;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      auStack_5e0._48_8_ = (uStack_590 >> 0x30) * 0x1000003d1 + auStack_5e0._48_8_;
      uStack_5a8 = ((ulong)auStack_5e0._48_8_ >> 0x34) + uStack_5a8;
      uStack_5a0 = (uStack_5a8 >> 0x34) + uStack_5a0;
      uVar27 = (uStack_5a0 >> 0x34) + uStack_598;
      psVar32 = (secp256k1_ge *)0xfffffffffffff;
      uStack_598 = uVar27 & 0xfffffffffffff;
      uStack_590 = (uVar27 >> 0x34) + (uStack_590 & 0xffffffffffff);
      uStack_5a0 = uStack_5a0 & 0xfffffffffffff;
      uStack_5a8 = uStack_5a8 & 0xfffffffffffff;
      auStack_5e0._48_8_ = auStack_5e0._48_8_ & 0xfffffffffffff;
      uStack_588 = CONCAT44(uStack_588._4_4_,1);
      psStack_5f8 = (secp256k1_ge *)0x14cd1e;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      psStack_5f8 = (secp256k1_ge *)0x14cd2e;
      secp256k1_fe_verify(&sStack_440.y);
      psVar31 = (secp256k1_ge *)0x1;
      psStack_5f8 = (secp256k1_ge *)0x14cd3b;
      secp256k1_fe_verify_magnitude(&sStack_440.y,1);
      auStack_5e0._0_8_ = 0x3ffffbfffff0bc - sStack_440.y.n[0];
      auStack_5e0._8_8_ = 0x3ffffffffffffc - sStack_440.y.n[1];
      auStack_5e0._16_8_ = 0x3ffffffffffffc - sStack_440.y.n[2];
      auStack_5e0._24_8_ = 0x3ffffffffffffc - sStack_440.y.n[3];
      auStack_5e0._32_8_ = 0x3fffffffffffc - sStack_440.y.n[4];
      auStack_5e0._40_4_ = 2;
      auStack_5e0._44_4_ = 0;
      psVar24 = (secp256k1_ge *)auStack_5e0;
      psStack_5f8 = (secp256k1_ge *)0x14cd8f;
      secp256k1_fe_verify((secp256k1_fe *)psVar24);
      psStack_5f8 = (secp256k1_ge *)0x14cd97;
      secp256k1_fe_verify((secp256k1_fe *)psVar24);
      a_01 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      psStack_5f8 = (secp256k1_ge *)0x14cda4;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      uVar11 = uStack_458;
      r_02 = (secp256k1_ge *)(ulong)uStack_458;
      if (0x20 < (int)(auStack_5e0._40_4_ + uStack_458)) goto LAB_0014d4a1;
      uStack_4f0 = auStack_4b0._48_8_;
      uStack_4e8 = uStack_478;
      auStack_5e0._0_8_ = auStack_5e0._0_8_ + auStack_4b0._48_8_;
      auStack_5e0._8_8_ = auStack_5e0._8_8_ + uStack_478;
      uStack_4e0 = uStack_470;
      uStack_4d8 = uStack_468;
      auStack_5e0._16_8_ = auStack_5e0._16_8_ + uStack_470;
      auStack_5e0._24_8_ = auStack_5e0._24_8_ + uStack_468;
      psStack_500 = psStack_460;
      auStack_5e0._32_8_ = (long)(psStack_460->x).n + auStack_5e0._32_8_;
      auStack_5e0._44_4_ = 0;
      auStack_5e0._40_4_ = auStack_5e0._40_4_ + uStack_458;
      psStack_5f8 = (secp256k1_ge *)0x14ce27;
      secp256k1_fe_verify((secp256k1_fe *)psVar24);
      psStack_5f8 = (secp256k1_ge *)0x14ce2f;
      secp256k1_fe_verify((secp256k1_fe *)psVar24);
      a_02 = (secp256k1_ge *)0x1000003d1;
      auStack_5e0._0_8_ = ((ulong)auStack_5e0._32_8_ >> 0x30) * 0x1000003d1 + auStack_5e0._0_8_;
      auStack_5e0._8_8_ = ((ulong)auStack_5e0._0_8_ >> 0x34) + auStack_5e0._8_8_;
      auStack_5e0._16_8_ = ((ulong)auStack_5e0._8_8_ >> 0x34) + auStack_5e0._16_8_;
      uVar27 = ((ulong)auStack_5e0._16_8_ >> 0x34) + auStack_5e0._24_8_;
      auStack_5e0._24_8_ = uVar27 & 0xfffffffffffff;
      auStack_5e0._32_8_ = (uVar27 >> 0x34) + (auStack_5e0._32_8_ & 0xffffffffffff);
      auStack_5e0._16_8_ = auStack_5e0._16_8_ & 0xfffffffffffff;
      auStack_5e0._8_8_ = auStack_5e0._8_8_ & 0xfffffffffffff;
      auStack_5e0._0_8_ = auStack_5e0._0_8_ & 0xfffffffffffff;
      auStack_5e0._40_4_ = 1;
      psStack_5f8 = (secp256k1_ge *)0x14ceb4;
      secp256k1_fe_verify((secp256k1_fe *)psVar24);
      psStack_5f8 = (secp256k1_ge *)0x14cebc;
      secp256k1_fe_verify((secp256k1_fe *)r_03);
      uVar27 = (uStack_590 >> 0x30) * 0x1000003d1 + auStack_5e0._48_8_;
      r_03 = (secp256k1_ge *)0xffffefffffc2f;
      if (((uVar27 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar27 & 0xfffffffffffff) == 0)) {
        uVar16 = (uVar27 >> 0x34) + uStack_5a8;
        uVar23 = (uVar16 >> 0x34) + uStack_5a0;
        uVar28 = (uVar23 >> 0x34) + uStack_598;
        uVar29 = (uVar28 >> 0x34) + (uStack_590 & 0xffffffffffff);
        if ((((uVar16 | uVar27 | uVar23 | uVar28) & 0xfffffffffffff) != 0 || uVar29 != 0) &&
           ((uVar27 + 0x1000003d0 & uVar16 & uVar23 & uVar28 & (uVar29 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d046;
        psStack_5f8 = (secp256k1_ge *)0x14cf84;
        secp256k1_fe_verify((secp256k1_fe *)auStack_5e0);
        uVar27 = ((ulong)auStack_5e0._32_8_ >> 0x30) * 0x1000003d1 + auStack_5e0._0_8_;
        if (((uVar27 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar27 & 0xfffffffffffff) != 0))
        goto LAB_0014d046;
        uVar16 = (uVar27 >> 0x34) + auStack_5e0._8_8_;
        psVar31 = (secp256k1_ge *)((uVar16 >> 0x34) + auStack_5e0._16_8_);
        a_01 = (secp256k1_ge *)(((ulong)psVar31 >> 0x34) + auStack_5e0._24_8_);
        uVar23 = ((ulong)a_01 >> 0x34) + (auStack_5e0._32_8_ & 0xffffffffffff);
        r_04 = psVar24;
        r_05 = a_02;
        if ((((uVar16 | uVar27 | (ulong)psVar31 | (ulong)a_01) & 0xfffffffffffff) != 0 ||
             uVar23 != 0) &&
           ((uVar27 + 0x1000003d0 & uVar16 & (ulong)psVar31 & (ulong)a_01 &
            (uVar23 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d046;
        goto LAB_0014d4bf;
      }
LAB_0014d046:
      psVar31 = (secp256k1_ge *)
                ((long)(psStack_508->x).n + (long)((secp256k1_fe *)auStack_580._56_8_)->n);
      psVar32 = &sStack_3d0;
      psStack_5f8 = (secp256k1_ge *)0x14d06a;
      secp256k1_ge_from_storage(psVar32,(secp256k1_ge_storage *)psVar31);
      psStack_5f8 = (secp256k1_ge *)0x14d072;
      a_01 = psVar32;
      iVar10 = secp256k1_ge_is_valid_var(psVar32);
      if (iVar10 == 0) goto LAB_0014d4a6;
      psStack_5f8 = (secp256k1_ge *)0x14d082;
      secp256k1_fe_verify(&psVar32->x);
      psVar31 = (secp256k1_ge *)0x1;
      psStack_5f8 = (secp256k1_ge *)0x14d08f;
      secp256k1_fe_verify_magnitude(&psVar32->x,1);
      auStack_580._0_8_ = 0x3ffffbfffff0bc - sStack_3d0.x.n[0];
      auStack_580._8_8_ = 0x3ffffffffffffc - sStack_3d0.x.n[1];
      auStack_580._16_8_ = 0x3ffffffffffffc - sStack_3d0.x.n[2];
      auStack_580._24_8_ = 0x3ffffffffffffc - sStack_3d0.x.n[3];
      auStack_580._32_8_ = 0x3fffffffffffc - sStack_3d0.x.n[4];
      auStack_580._40_8_ = 2;
      psVar18 = (secp256k1_ge *)auStack_580;
      psStack_5f8 = (secp256k1_ge *)0x14d0f3;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      psStack_5f8 = (secp256k1_ge *)0x14d0fb;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      a_01 = (secp256k1_ge *)auStack_4b0;
      psStack_5f8 = (secp256k1_ge *)0x14d108;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      r_04 = psStack_500;
      if (0x20 < (int)(auStack_580._40_4_ + uStack_5e4)) goto LAB_0014d4ab;
      psVar32 = (secp256k1_ge *)0xffffefffffc2f;
      r_03 = (secp256k1_ge *)0x1000003d1;
      auStack_580._0_8_ = uStack_4d0 + auStack_580._0_8_;
      auStack_580._8_8_ = uStack_4c8 + auStack_580._8_8_;
      auStack_580._16_8_ = uStack_4c0 + auStack_580._16_8_;
      auStack_580._24_8_ = uStack_4b8 + auStack_580._24_8_;
      auStack_580._32_8_ = auStack_580._32_8_ + uStack_4f8;
      auStack_580._44_4_ = 0;
      auStack_580._40_4_ = auStack_580._40_4_ + uStack_5e4;
      psStack_5f8 = (secp256k1_ge *)0x14d186;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      uStack_520 = sStack_3d0.y.n[4];
      uStack_518._0_4_ = sStack_3d0.y.magnitude;
      uStack_518._4_4_ = sStack_3d0.y.normalized;
      uStack_530 = sStack_3d0.y.n[2];
      uStack_528 = sStack_3d0.y.n[3];
      auStack_580._64_8_ = sStack_3d0.y.n[0];
      uStack_538 = sStack_3d0.y.n[1];
      r_05 = (secp256k1_ge *)(auStack_580 + 0x40);
      psStack_5f8 = (secp256k1_ge *)0x14d1c1;
      secp256k1_fe_verify((secp256k1_fe *)r_05);
      a_01 = (secp256k1_ge *)(auStack_4b0 + 0x30);
      psStack_5f8 = (secp256k1_ge *)0x14d1ce;
      secp256k1_fe_verify((secp256k1_fe *)a_01);
      uVar11 = uVar11 + (int)uStack_518;
      r_02 = (secp256k1_ge *)(ulong)uVar11;
      psVar24 = r_04;
      a_02 = r_05;
      if (0x20 < (int)uVar11) goto LAB_0014d4b0;
      auStack_580._64_8_ = uStack_4f0 + auStack_580._64_8_;
      uStack_538 = uStack_4e8 + uStack_538;
      uStack_530 = uStack_4e0 + uStack_530;
      uStack_528 = uStack_4d8 + uStack_528;
      uStack_520 = (long)(r_04->x).n + uStack_520;
      uStack_518 = (ulong)uVar11;
      psStack_5f8 = (secp256k1_ge *)0x14d236;
      secp256k1_fe_verify((secp256k1_fe *)r_05);
      psStack_5f8 = (secp256k1_ge *)0x14d23e;
      secp256k1_fe_verify((secp256k1_fe *)psVar18);
      uVar27 = ((ulong)auStack_580._32_8_ >> 0x30) * 0x1000003d1 + auStack_580._0_8_;
      if (((uVar27 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar27 & 0xfffffffffffff) == 0)) {
        uVar16 = (uVar27 >> 0x34) + auStack_580._8_8_;
        uVar23 = (uVar16 >> 0x34) + auStack_580._16_8_;
        uVar28 = (uVar23 >> 0x34) + auStack_580._24_8_;
        uVar29 = (uVar28 >> 0x34) + (auStack_580._32_8_ & 0xffffffffffff);
        if ((((uVar16 | uVar27 | uVar23 | uVar28) & 0xfffffffffffff) != 0 || uVar29 != 0) &&
           ((uVar27 + 0x1000003d0 & uVar16 & uVar23 & uVar28 & (uVar29 ^ 0xf000000000000)) !=
            0xfffffffffffff)) goto LAB_0014d3de;
        psStack_5f8 = (secp256k1_ge *)0x14d30d;
        secp256k1_fe_verify((secp256k1_fe *)r_05);
        uVar27 = (uStack_520 >> 0x30) * 0x1000003d1 + auStack_580._64_8_;
        if (((uVar27 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar27 & 0xfffffffffffff) != 0))
        goto LAB_0014d3de;
        uVar16 = (uVar27 >> 0x34) + uStack_538;
        psVar31 = (secp256k1_ge *)((uVar16 >> 0x34) + uStack_530);
        a_01 = (secp256k1_ge *)(((ulong)psVar31 >> 0x34) + uStack_528);
        uVar23 = ((ulong)a_01 >> 0x34) + (uStack_520 & 0xffffffffffff);
        if ((((uVar16 | uVar27 | (ulong)psVar31 | (ulong)a_01) & 0xfffffffffffff) != 0 ||
             uVar23 != 0) &&
           ((uVar27 + 0x1000003d0 & uVar16 & (ulong)psVar31 & (ulong)a_01 &
            (uVar23 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_0014d3de;
        goto LAB_0014d4c4;
      }
LAB_0014d3de:
      a_02 = (secp256k1_ge *)(auStack_5e0 + 0x30);
      psVar18 = (secp256k1_ge *)auStack_580;
      psStack_5f8 = (secp256k1_ge *)0x14d3f6;
      iVar10 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)psVar18);
      r_03 = (secp256k1_ge *)auStack_5e0;
      if (iVar10 != 0) {
        psStack_5f8 = (secp256k1_ge *)0x14d40a;
        psVar31 = r_05;
        a_01 = r_03;
        iVar10 = secp256k1_fe_equal((secp256k1_fe *)r_03,(secp256k1_fe *)r_05);
        if (iVar10 == 0) goto LAB_0014d412;
        goto LAB_0014d4ba;
      }
LAB_0014d412:
      psStack_5f8 = (secp256k1_ge *)0x14d420;
      secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)r_05);
      psStack_5f8 = (secp256k1_ge *)0x14d42e;
      secp256k1_fe_mul((secp256k1_fe *)r_03,(secp256k1_fe *)r_03,(secp256k1_fe *)psVar18);
      psStack_5f8 = (secp256k1_ge *)0x14d439;
      psVar31 = r_03;
      a_01 = a_02;
      iVar10 = secp256k1_fe_equal((secp256k1_fe *)a_02,(secp256k1_fe *)r_03);
      if (iVar10 == 0) goto LAB_0014d4b5;
      psVar31 = &sStack_3d0;
      psVar18 = &sStack_440;
      for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
        (psVar18->x).n[0] = (psVar31->x).n[0];
        psVar31 = (secp256k1_ge *)((long)psVar31 + ((ulong)bVar9 * -2 + 1) * 8);
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      r_02 = (secp256k1_ge *)(((secp256k1_fe *)(auStack_580._56_8_ + 0x30))->n + 2);
      if (r_02 == (secp256k1_ge *)0x80000) {
        return;
      }
    }
    psStack_5f8 = (secp256k1_ge *)0x14d4a1;
    test_pre_g_table_cold_9();
LAB_0014d4a1:
    psStack_5f8 = (secp256k1_ge *)0x14d4a6;
    test_pre_g_table_cold_8();
LAB_0014d4a6:
    psStack_5f8 = (secp256k1_ge *)0x14d4ab;
    test_pre_g_table_cold_7();
LAB_0014d4ab:
    psStack_5f8 = (secp256k1_ge *)0x14d4b0;
    test_pre_g_table_cold_6();
LAB_0014d4b0:
    r_05 = psVar24;
    psStack_5f8 = (secp256k1_ge *)0x14d4b5;
    test_pre_g_table_cold_5();
LAB_0014d4b5:
    psStack_5f8 = (secp256k1_ge *)0x14d4ba;
    test_pre_g_table_cold_4();
LAB_0014d4ba:
    psStack_5f8 = (secp256k1_ge *)0x14d4bf;
    test_pre_g_table_cold_3();
    r_04 = r_05;
    r_05 = a_02;
LAB_0014d4bf:
    psStack_5f8 = (secp256k1_ge *)0x14d4c4;
    test_pre_g_table_cold_1();
LAB_0014d4c4:
    psStack_5f8 = (secp256k1_ge *)0x14d4c9;
    test_pre_g_table_cold_2();
  }
  psStack_5f8 = (secp256k1_ge *)secp256k1_wnaf_fixed;
  test_pre_g_table_cold_10();
  pcStack_650 = (code *)0x14d4ed;
  psVar24 = psVar31;
  psStack_620 = r_02;
  psStack_618 = psVar32;
  psStack_610 = r_03;
  psStack_608 = r_04;
  psStack_600 = r_05;
  psStack_5f8 = psVar18;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar31);
  auVar39._0_4_ = -(uint)((int)(psVar31->x).n[2] == 0 && (int)(psVar31->x).n[0] == 0);
  auVar39._4_4_ =
       -(uint)(*(int *)((long)(psVar31->x).n + 0x14) == 0 && *(int *)((long)(psVar31->x).n + 4) == 0
              );
  auVar39._8_4_ = -(uint)((int)(psVar31->x).n[3] == 0 && (int)(psVar31->x).n[1] == 0);
  auVar39._12_4_ =
       -(uint)(*(int *)((long)(psVar31->x).n + 0x1c) == 0 &&
              *(int *)((long)(psVar31->x).n + 0xc) == 0);
  iVar10 = movmskps(extraout_EAX,auVar39);
  if (iVar10 == 0xf) {
    if (-1 < (int)(0x7f / (long)(int)extraout_EDX)) {
      pcStack_650 = (code *)0x14d5e7;
      memset(a_01,0,(0x7f / (long)(int)extraout_EDX & 0xffffffffU) * 4 + 4);
    }
    return;
  }
  pcStack_650 = (code *)0x14d51a;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar31);
  uVar11 = (uint)(psVar31->x).n[0];
  pcStack_650 = (code *)0x14d526;
  psVar18 = psVar31;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar31);
  if (0xffffffdf < extraout_EDX - 0x21) {
    uVar11 = ~uVar11 & 1;
    pcStack_650 = (code *)0x14d544;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar31);
    bVar14 = (byte)extraout_EDX;
    *(uint *)(a_01->x).n =
         ((uint)((int)(psVar31->x).n[extraout_EDX - 1 >> 6] << (-bVar14 & 0x1f)) >> (-bVar14 & 0x1f)
         ) + uVar11;
    bVar9 = 0x7f / bVar14;
    uStack_628 = (ulong)bVar9;
    uVar17 = (uint)bVar9;
    uVar33 = 0x80 - bVar9 * extraout_EDX;
    uVar27 = uStack_628;
    uStack_63c = uVar11;
    psStack_630 = psVar31;
    do {
      uVar11 = extraout_EDX;
      if (uVar27 == uStack_628) {
        uVar11 = uVar33;
      }
      pcStack_650 = (code *)0x14d59f;
      uVar12 = secp256k1_scalar_get_bits_var
                         ((secp256k1_scalar *)psStack_630,(uint)uVar27 * extraout_EDX,uVar11);
      uVar11 = (uint)uVar27;
      if (uVar12 != 0) break;
      *(undefined4 *)((long)(a_01->x).n + uVar27 * 4) = 0;
      uVar17 = uVar17 - 1;
      bVar38 = 1 < (long)uVar27;
      uVar27 = uVar27 - 1;
      uVar11 = uVar17;
    } while (bVar38);
    if ((int)uVar11 < 1) {
      return;
    }
    iStack_638 = -1 << (bVar14 & 0x1f);
    iStack_634 = 1 << (bVar14 & 0x1f);
    uVar27 = 1;
    uVar17 = extraout_EDX;
    do {
      count = extraout_EDX;
      if (uStack_628 == uVar27) {
        count = uVar33;
      }
      pcStack_650 = (code *)0x14d63c;
      uVar12 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psStack_630,uVar17,count);
      if ((uVar12 & 1) == 0) {
        piVar3 = (int *)((long)(a_01->x).n + uVar27 * 4 + -4);
        *piVar3 = *piVar3 + iStack_638;
        uVar12 = uVar12 | 1;
      }
      *(uint32_t *)((long)(a_01->x).n + uVar27 * 4) = uVar12;
      if (1 < uVar27) {
        iVar10 = *(int *)((long)(a_01->x).n + uVar27 * 4 + -4);
        if (iVar10 == -1) {
          iVar10 = *(int *)((long)(a_01->x).n + uVar27 * 4 + -8);
          if (0 < iVar10) {
            iVar10 = iVar10 + iStack_638;
            goto LAB_0014d681;
          }
        }
        else if ((iVar10 == 1) &&
                (iVar10 = *(int *)((long)(a_01->x).n + uVar27 * 4 + -8), iVar10 < 0)) {
          iVar10 = iVar10 + iStack_634;
LAB_0014d681:
          *(int *)((long)(a_01->x).n + uVar27 * 4 + -8) = iVar10;
          *(undefined4 *)((long)(a_01->x).n + uVar27 * 4 + -4) = 0;
        }
      }
      uVar27 = uVar27 + 1;
      uVar17 = uVar17 + extraout_EDX;
      if (uVar11 + 1 == uVar27) {
        return;
      }
    } while( true );
  }
  pcStack_650 = test_fixed_wnaf_small_helper;
  secp256k1_wnaf_fixed_cold_1();
  uVar27 = 0x20;
  do {
    uVar17 = (int)uVar27 - 1;
    uVar27 = (ulong)uVar17;
    if (*(int *)((long)(psVar18->x).n + uVar27 * 4) != 0) {
      pcStack_658 = (code *)0x14d6e2;
      test_fixed_wnaf_small_helper_cold_1();
      goto LAB_0014d6e2;
    }
  } while (8 < uVar17);
  uVar17 = 7;
  while (*(int *)((long)(psVar18->x).n + (ulong)uVar17 * 4) ==
         *(int *)((long)(psVar24->x).n + (ulong)uVar17 * 4)) {
    bVar38 = uVar17 == 0;
    uVar17 = uVar17 - 1;
    if (bVar38) {
      return;
    }
  }
LAB_0014d6e2:
  pcStack_658 = test_ecmult_target;
  test_fixed_wnaf_small_helper_cold_2();
  psVar21 = (secp256k1_gej *)auStack_1278;
  psVar19 = (secp256k1_strauss_point_state *)((ulong)psVar24 & 0xffffffff);
  psVar36 = (secp256k1_scalar *)auStack_1258;
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d70a;
  psStack_680 = a_01;
  psStack_678 = psVar31;
  psStack_670 = r_03;
  uStack_668 = (ulong)extraout_EDX;
  psStack_660 = r_05;
  pcStack_658 = (code *)(ulong)uVar11;
  testutil_random_scalar_order_test(psVar36);
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d71b;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_1278,psVar36,(secp256k1_scalar *)psVar18);
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d726;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_1278,(secp256k1_scalar *)auStack_1278);
  if ((int)psVar24 == 0) {
    psStack_1280 = (secp256k1_strauss_point_state *)0x14d81f;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_10f0,(secp256k1_scalar *)auStack_1258);
    psStack_1280 = (secp256k1_strauss_point_state *)0x14d836;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1188,(secp256k1_scalar *)auStack_1278);
    psStack_1280 = (secp256k1_strauss_point_state *)0x14d84a;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1220,(secp256k1_scalar *)psVar18);
  }
  else {
    psStack_1280 = (secp256k1_strauss_point_state *)0x14d73e;
    testutil_random_ge_test(&sStack_1058);
    psStack_1280 = (secp256k1_strauss_point_state *)0x14d74e;
    secp256k1_gej_set_ge(&sStack_ff0,&sStack_1058);
    if ((int)psVar24 == 1) {
      psVar31 = asStack_f58;
      r_03 = asStack_dd8;
      psVar19 = &sStack_a98;
      psVar36 = &secp256k1_scalar_zero;
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d7ae;
      sStack_1188.x.n[0] = (uint64_t)psVar31;
      sStack_1188.x.n[1] = (uint64_t)r_03;
      sStack_1188.x.n[2] = (uint64_t)psVar19;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1188,&sStack_10f0,1,&sStack_ff0,
                 (secp256k1_scalar *)auStack_1258,&secp256k1_scalar_zero);
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d7d9;
      sStack_1220.x.n[0] = (uint64_t)psVar31;
      sStack_1220.x.n[1] = (uint64_t)r_03;
      sStack_1220.x.n[2] = (uint64_t)psVar19;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&sStack_1220,&sStack_1188,1,&sStack_ff0,
                 (secp256k1_scalar *)auStack_1278,&secp256k1_scalar_zero);
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d801;
      auStack_1258._32_8_ = psVar31;
      psStack_1230 = r_03;
      psStack_1228 = psVar19;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)(auStack_1258 + 0x20),&sStack_1220,1,&sStack_ff0,
                 (secp256k1_scalar *)psVar18,&secp256k1_scalar_zero);
      psVar21 = &sStack_ff0;
    }
    else {
      psVar36 = (secp256k1_scalar *)&sStack_1058;
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d869;
      secp256k1_ecmult_const(&sStack_10f0,(secp256k1_ge *)psVar36,(secp256k1_scalar *)auStack_1258);
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d87c;
      secp256k1_ecmult_const(&sStack_1188,(secp256k1_ge *)psVar36,(secp256k1_scalar *)auStack_1278);
      psStack_1280 = (secp256k1_strauss_point_state *)0x14d88c;
      secp256k1_ecmult_const(&sStack_1220,(secp256k1_ge *)psVar36,(secp256k1_scalar *)psVar18);
      psVar21 = (secp256k1_gej *)auStack_1278;
    }
  }
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d8a6;
  secp256k1_gej_add_var(&sStack_1220,&sStack_1220,&sStack_10f0,(secp256k1_fe *)0x0);
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d8bb;
  psVar25 = &sStack_1220;
  secp256k1_gej_add_var(&sStack_1220,&sStack_1220,&sStack_1188,(secp256k1_fe *)0x0);
  psStack_1280 = (secp256k1_strauss_point_state *)0x14d8c3;
  psVar22 = &sStack_1220;
  secp256k1_gej_verify(&sStack_1220);
  if (sStack_1220.infinity != 0) {
    return;
  }
  psStack_1280 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (uchar *)((ulong)psVar22 & 0xffffffff);
  pcStack_13e8 = (code *)0x14d911;
  psStack_13d0 = psVar25;
  lStack_13c8 = extraout_RDX;
  psStack_12a8 = &sStack_1220;
  psStack_12a0 = psVar31;
  psStack_1298 = r_03;
  psStack_1290 = (secp256k1_ge *)psVar36;
  psStack_1288 = psVar21;
  psStack_1280 = psVar19;
  scratch = secp256k1_scratch_space_create(CTX,0x10000);
  uStack_13d6 = SUB84(psVar22,0);
  psVar37 = &sStack_1310;
  sStack_1310.s[0] = 0x6a09e667;
  sStack_1310.s[1] = 0xbb67ae85;
  sStack_1310.s[2] = 0x3c6ef372;
  sStack_1310.s[3] = 0xa54ff53a;
  sStack_1310.s[4] = 0x510e527f;
  sStack_1310.s[5] = 0x9b05688c;
  sStack_1310.s[6] = 0x1f83d9ab;
  sStack_1310.s[7] = 0x5be0cd19;
  psVar25 = (secp256k1_gej *)0x0;
  sStack_1310.bytes = 0;
  psVar36 = (secp256k1_scalar *)(auStack_13c0 + 0x20);
  auStack_13c0._32_8_ = 0;
  uStack_1398._0_4_ = 0;
  uStack_1398._4_4_ = 0;
  uStack_1390 = 0;
  uStack_1388 = 0;
  pcStack_13e8 = (code *)0x14d95b;
  secp256k1_scalar_verify(psVar36);
  pcStack_13e8 = (code *)0x14d969;
  test_ecmult_accumulate(psVar37,psVar36,scratch);
  auStack_13c0._32_8_ = 1;
  uStack_1398._0_4_ = 0;
  uStack_1398._4_4_ = 0;
  uStack_1390 = 0;
  uStack_1388 = 0;
  pcStack_13e8 = (code *)0x14d985;
  secp256k1_scalar_verify(psVar36);
  pcStack_13e8 = (code *)0x14d993;
  test_ecmult_accumulate(psVar37,psVar36,scratch);
  pcStack_13e8 = (code *)0x14d99e;
  secp256k1_scalar_negate(psVar36,psVar36);
  pcStack_13e8 = (code *)0x14d9af;
  test_ecmult_accumulate(psVar37,psVar36,scratch);
  psVar21 = psStack_13d0;
  if (psStack_13d0 != (secp256k1_gej *)0x0) {
    psVar25 = (secp256k1_gej *)0x0;
    psVar37 = &sStack_1380;
    out32 = auStack_13c0;
    do {
      uStack_13d2 = SUB82(psVar25,0);
      sStack_1380.s[0] = 0x6a09e667;
      sStack_1380.s[1] = 0xbb67ae85;
      sStack_1380.s[2] = 0x3c6ef372;
      sStack_1380.s[3] = 0xa54ff53a;
      sStack_1380.s[4] = 0x510e527f;
      sStack_1380.s[5] = 0x9b05688c;
      sStack_1380.s[6] = 0x1f83d9ab;
      sStack_1380.s[7] = 0x5be0cd19;
      sStack_1380.bytes = 0;
      pcStack_13e8 = (code *)0x14da0b;
      secp256k1_sha256_write(psVar37,(uchar *)&uStack_13d6,6);
      pcStack_13e8 = (code *)0x14da16;
      secp256k1_sha256_finalize(psVar37,out32);
      pcStack_13e8 = (code *)0x14da23;
      secp256k1_scalar_set_b32((secp256k1_scalar *)(auStack_13c0 + 0x20),out32,(int *)0x0);
      pcStack_13e8 = (code *)0x14da36;
      test_ecmult_accumulate(&sStack_1310,(secp256k1_scalar *)(auStack_13c0 + 0x20),scratch);
      psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + 1);
    } while (psVar21 != psVar25);
  }
  hash = &sStack_1310;
  psVar31 = (secp256k1_ge *)auStack_13c0;
  pcStack_13e8 = (code *)0x14da50;
  secp256k1_sha256_finalize(hash,(uchar *)psVar31);
  lVar15 = 0;
  while (auStack_13c0[lVar15] == *(char *)(lStack_13c8 + lVar15)) {
    lVar15 = lVar15 + 1;
    if (lVar15 == 0x20) {
      pcStack_13e8 = (code *)0x14da78;
      secp256k1_scratch_space_destroy(CTX,scratch);
      return;
    }
  }
  pcStack_13e8 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  psStack_13f0 = psVar21;
  auStack_2098 = (undefined1  [8])0x41;
  psStack_20b0 = (secp256k1_scalar *)0x14dac8;
  psStack_1410 = scratch;
  psStack_1408 = psVar37;
  puStack_1400 = auStack_13c0 + 0x20;
  psStack_13f8 = psVar25;
  pcStack_13e8 = (code *)out32;
  secp256k1_gej_set_ge(&sStack_1eb0,&secp256k1_ge_const_g);
  psStack_20b0 = (secp256k1_scalar *)0x14dad5;
  secp256k1_gej_set_infinity(&sStack_1f48);
  psStack_20b0 = (secp256k1_scalar *)0x14daec;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1e18 + 1,(secp256k1_scalar *)psVar31);
  psVar19 = (secp256k1_strauss_point_state *)(asStack_1b68[5].y.n + 3);
  psStack_20b0 = (secp256k1_scalar *)0x14db3e;
  sStack_1fe0.x.n[0] = (uint64_t)asStack_1ce8;
  sStack_1fe0.x.n[1] = (uint64_t)asStack_1b68;
  sStack_1fe0.x.n[2] = (uint64_t)psVar19;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1fe0,&sStack_1e18,1,&sStack_1eb0,
             (secp256k1_scalar *)psVar31,&secp256k1_scalar_zero);
  psStack_20b0 = (secp256k1_scalar *)0x14db6e;
  auStack_2090._0_8_ = asStack_1ce8;
  auStack_2090._8_8_ = asStack_1b68;
  auStack_2090._16_8_ = psVar19;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)auStack_2090,&sStack_1fe0,1,&sStack_1f48,
             &secp256k1_scalar_zero,(secp256k1_scalar *)psVar31);
  error_callback = (secp256k1_callback *)0xd0;
  psVar21 = (secp256k1_gej *)&CTX->error_callback;
  cb = (secp256k1_ecmult_multi_callback *)0x0;
  psVar32 = (secp256k1_ge *)0x0;
  psStack_20b0 = (secp256k1_scalar *)0x14db9f;
  psVar36 = (secp256k1_scalar *)psVar31;
  psVar18 = scratch_00;
  iVar10 = secp256k1_ecmult_multi_var
                     ((secp256k1_callback *)psVar21,(secp256k1_scratch *)scratch_00,
                      (secp256k1_gej *)(asStack_1b68[5].y.n + 3),(secp256k1_scalar *)psVar31,
                      (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  if (iVar10 == 0) {
    psStack_20b0 = (secp256k1_scalar *)0x14dd04;
    test_ecmult_accumulate_cold_8();
LAB_0014dd04:
    psStack_20b0 = (secp256k1_scalar *)0x14dd09;
    test_ecmult_accumulate_cold_7();
LAB_0014dd09:
    psStack_20b0 = (secp256k1_scalar *)0x14dd0e;
    test_ecmult_accumulate_cold_6();
LAB_0014dd0e:
    psStack_20b0 = (secp256k1_scalar *)0x14dd13;
    test_ecmult_accumulate_cold_5();
LAB_0014dd13:
    psStack_20b0 = (secp256k1_scalar *)0x14dd18;
    test_ecmult_accumulate_cold_4();
LAB_0014dd18:
    psStack_20b0 = (secp256k1_scalar *)0x14dd1d;
    test_ecmult_accumulate_cold_3();
LAB_0014dd1d:
    psStack_20b0 = (secp256k1_scalar *)0x14dd22;
    test_ecmult_accumulate_cold_2();
  }
  else {
    error_callback = &CTX->error_callback;
    psVar36 = &secp256k1_scalar_zero;
    cb = test_ecmult_accumulate_cb;
    psStack_20b0 = (secp256k1_scalar *)0x14dbda;
    psVar18 = scratch_00;
    psVar21 = (secp256k1_gej *)error_callback;
    psVar32 = psVar31;
    iVar10 = secp256k1_ecmult_multi_var
                       (error_callback,(secp256k1_scratch *)scratch_00,asStack_1b68,
                        &secp256k1_scalar_zero,test_ecmult_accumulate_cb,psVar31,1);
    if (iVar10 == 0) goto LAB_0014dd04;
    psStack_20b0 = (secp256k1_scalar *)0x14dbf9;
    secp256k1_ecmult_const(asStack_1ce8,&secp256k1_ge_const_g,(secp256k1_scalar *)psVar31);
    psVar31 = (secp256k1_ge *)auStack_2090;
    psStack_20b0 = (secp256k1_scalar *)0x14dc0e;
    secp256k1_ge_set_gej_var(psVar31,&sStack_1e18 + 1);
    psVar21 = &sStack_1e18;
    psStack_20b0 = (secp256k1_scalar *)0x14dc1e;
    psVar18 = psVar31;
    iVar10 = secp256k1_gej_eq_ge_var(psVar21,psVar31);
    if (iVar10 == 0) goto LAB_0014dd09;
    psVar21 = &sStack_1fe0;
    psVar18 = (secp256k1_ge *)auStack_2090;
    psStack_20b0 = (secp256k1_scalar *)0x14dc38;
    iVar10 = secp256k1_gej_eq_ge_var(psVar21,psVar18);
    if (iVar10 == 0) goto LAB_0014dd0e;
    psVar21 = (secp256k1_gej *)(asStack_1b68[5].y.n + 3);
    psVar18 = (secp256k1_ge *)auStack_2090;
    psStack_20b0 = (secp256k1_scalar *)0x14dc52;
    iVar10 = secp256k1_gej_eq_ge_var(psVar21,psVar18);
    if (iVar10 == 0) goto LAB_0014dd13;
    psVar21 = asStack_1b68;
    psVar18 = (secp256k1_ge *)auStack_2090;
    psStack_20b0 = (secp256k1_scalar *)0x14dc6c;
    iVar10 = secp256k1_gej_eq_ge_var(psVar21,psVar18);
    if (iVar10 == 0) goto LAB_0014dd18;
    psVar21 = asStack_1ce8;
    psVar18 = (secp256k1_ge *)auStack_2090;
    psStack_20b0 = (secp256k1_scalar *)0x14dc86;
    iVar10 = secp256k1_gej_eq_ge_var(psVar21,psVar18);
    if (iVar10 == 0) goto LAB_0014dd1d;
    psStack_20b0 = (secp256k1_scalar *)0x14dc9b;
    secp256k1_ge_verify((secp256k1_ge *)auStack_2090);
    if (auStack_2090._96_4_ != 0) {
      auStack_2090[0x68] = 0;
      sVar34 = 1;
LAB_0014dce3:
      psStack_20b0 = (secp256k1_scalar *)0x14dced;
      secp256k1_sha256_write(hash,auStack_2090 + 0x68,sVar34);
      return;
    }
    psVar21 = (secp256k1_gej *)auStack_2090;
    psVar18 = (secp256k1_ge *)(auStack_2090 + 0x68);
    psVar31 = (secp256k1_ge *)auStack_2098;
    psVar36 = (secp256k1_scalar *)0x0;
    psStack_20b0 = (secp256k1_scalar *)0x14dcd0;
    secp256k1_eckey_pubkey_serialize((secp256k1_ge *)psVar21,(uchar *)psVar18,(size_t *)psVar31,0);
    if (auStack_2098 == (undefined1  [8])0x41) {
      sVar34 = 0x41;
      goto LAB_0014dce3;
    }
  }
  psStack_20b0 = (secp256k1_scalar *)secp256k1_ecmult_multi_var;
  test_ecmult_accumulate_cold_1();
  psStack_20b0 = &secp256k1_scalar_zero;
  psStack_20d8 = asStack_1ce8;
  psStack_20d0 = error_callback;
  psStack_20c0 = psVar31;
  psStack_20b8 = psVar19;
  secp256k1_gej_set_infinity(r_01);
  if ((secp256k1_ge *)psVar36 != (secp256k1_ge *)0x0 || hash != (secp256k1_sha256 *)0x0) {
    if (hash == (secp256k1_sha256 *)0x0) {
      sStack_29c8.aux = asStack_25a0;
      sStack_29c8.pre_a = asStack_2420;
      sStack_29c8.ps = &sStack_29b0;
      secp256k1_ecmult_strauss_wnaf(&sStack_29c8,r_01,1,r_01,&secp256k1_scalar_zero,psVar36);
    }
    else {
      if ((psVar18 == (secp256k1_ge *)0x0) ||
         (sVar34 = secp256k1_pippenger_max_points
                             ((secp256k1_callback *)psVar21,(secp256k1_scratch *)psVar18),
         sVar34 == 0)) {
LAB_0014df51:
        secp256k1_ecmult_multi_simple_var(r_01,psVar36,cb,psVar32,(size_t)hash);
        return;
      }
      uVar27 = 5000000;
      if (sVar34 < 5000000) {
        uVar27 = sVar34;
      }
      puVar1 = (undefined1 *)((long)&hash[-1].bytes + 7);
      uStack_29d0 = (ulong)puVar1 / uVar27 + 1;
      uVar27 = (ulong)puVar1 / uStack_29d0;
      if (uVar27 < 0x57) {
        lVar15 = 0;
        do {
          if (*(char *)((long)(psVar18->x).n + lVar15) != "scratch"[lVar15]) {
            (*(code *)(psVar21->x).n[0])("invalid scratch space",(psVar21->x).n[1]);
            goto LAB_0014df51;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
        uVar16 = (psVar18->x).n[3] - (psVar18->x).n[2];
        uVar27 = 0;
        if (0x4a < uVar16) {
          uVar27 = uVar16 - 0x4b;
        }
        if (uVar27 < 0x988) goto LAB_0014df51;
        uVar27 = uVar27 / 0x988;
        if (4999999 < uVar27) {
          uVar27 = 5000000;
        }
        uStack_29d0 = (ulong)puVar1 / uVar27 + 1;
        uVar27 = (ulong)puVar1 / uStack_29d0;
        pcVar13 = secp256k1_ecmult_strauss_batch;
      }
      else {
        pcVar13 = secp256k1_ecmult_pippenger_batch;
      }
      psVar37 = (secp256k1_sha256 *)(uVar27 + 1);
      lVar15 = 0;
      uVar27 = 0;
      do {
        psVar20 = psVar37;
        if (hash < psVar37) {
          psVar20 = hash;
        }
        psVar31 = (secp256k1_ge *)0x0;
        if (uVar27 == 0) {
          psVar31 = (secp256k1_ge *)psVar36;
        }
        iVar10 = (*pcVar13)(psVar21,psVar18,&sStack_29b0,psVar31,cb,psVar32,psVar20,lVar15);
        if (iVar10 == 0) {
          return;
        }
        secp256k1_gej_add_var(r_01,r_01,(secp256k1_gej *)&sStack_29b0,(secp256k1_fe *)0x0);
        hash = (secp256k1_sha256 *)((long)hash - (long)psVar20);
        uVar27 = uVar27 + 1;
        lVar15 = (long)psVar37->s + lVar15;
      } while (uStack_29d0 != uVar27);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}